

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::SubscriptionSyncTest_test_summarize_Test::
TestBody(SubscriptionSyncTest_test_summarize_Test *this)

{
  char *pcVar1;
  AssertHelper local_c0;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_88;
  SubscriptionSync subscription_sync;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_88,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync
            (&subscription_sync,0x7b,&local_88);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_88);
  bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[86],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"SubscriptionSync(edition=123, compressed=false, controls=0, changed=true, subjects=2)\""
             ,"subscription_sync.Summarize()",
             (char (*) [86])
             "SubscriptionSync(edition=123, compressed=false, controls=0, changed=true, subjects=2)"
             ,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)&subscription_sync,REFRESH);
    bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)&subscription_sync,TOGGLE);
    bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_();
    testing::internal::CmpHelperEQ<char[86],std::__cxx11::string>
              ((internal *)&gtest_ar,
               "\"SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2)\""
               ,"subscription_sync.Summarize()",
               (char (*) [86])
               "SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2)"
               ,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bidfx_public_api::price::pixie::SubscriptionSync::SetCompressed(SUB81(&subscription_sync,0));
      bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_();
      testing::internal::CmpHelperEQ<char[85],std::__cxx11::string>
                ((internal *)&gtest_ar,
                 "\"SubscriptionSync(edition=123, compressed=true, controls=2, changed=true, subjects=2)\""
                 ,"subscription_sync.Summarize()",
                 (char (*) [85])
                 "SubscriptionSync(edition=123, compressed=true, controls=2, changed=true, subjects=2)"
                 ,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_a8);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
                   ,0x5b,pcVar1);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a8);
      }
      goto LAB_0019b2fb;
    }
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a8);
LAB_0019b2fb:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  SubscriptionSync::~SubscriptionSync(&subscription_sync);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_summarize)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=false, controls=0, changed=true, subjects=2)",
                 subscription_sync.Summarize());

    subscription_sync.AddControl(0, ControlOperationEnum::TOGGLE);
    subscription_sync.AddControl(1, ControlOperationEnum::REFRESH);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2)",
                 subscription_sync.Summarize());

    subscription_sync.SetCompressed(true);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=true, controls=2, changed=true, subjects=2)",
                 subscription_sync.Summarize());
}